

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,ArrayPtr<const_char> *first,
          ArrayPtr<const_char> *rest,ArrayPtr<const_char> *rest_1,String *rest_2,
          ArrayPtr<const_char> *rest_3,ArrayPtr<const_char> *rest_4,ArrayPtr<const_char> *rest_5,
          String *rest_6,ArrayPtr<const_char> *rest_7,CappedArray<char,_14UL> *rest_8,
          ArrayPtr<const_char> *rest_9,StringTree *rest_10,ArrayPtr<const_char> *rest_11,
          ArrayPtr<const_char> *rest_12,ArrayPtr<const_char> *rest_13,ArrayPtr<const_char> *rest_14,
          ArrayPtr<const_char> *rest_15,String *rest_16,ArrayPtr<const_char> *rest_17,
          ArrayPtr<const_char> *rest_18,ArrayPtr<const_char> *rest_19,String *rest_20,
          ArrayPtr<const_char> *rest_21,CappedArray<char,_14UL> *rest_22,
          ArrayPtr<const_char> *rest_23,StringTree *rest_24,ArrayPtr<const_char> *rest_25,
          String *rest_26,ArrayPtr<const_char> *rest_27,ArrayPtr<const_char> *rest_28,
          ArrayPtr<const_char> *rest_29,ArrayPtr<const_char> *rest_30,ArrayPtr<const_char> *rest_31,
          ArrayPtr<const_char> *rest_32,ArrayPtr<const_char> *rest_33,String *rest_34,
          ArrayPtr<const_char> *rest_35,CappedArray<char,_14UL> *rest_36,
          ArrayPtr<const_char> *rest_37)

{
  ArrayPtr<const_char> *pAVar1;
  char *pos_00;
  ArrayPtr<const_char> *rest_38;
  String *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  ArrayPtr<const_char> *rest_4_00;
  String *rest_5_00;
  ArrayPtr<const_char> *rest_6_00;
  CappedArray<char,_14UL> *rest_7_00;
  ArrayPtr<const_char> *rest_8_00;
  StringTree *rest_9_00;
  ArrayPtr<const_char> *rest_10_00;
  ArrayPtr<const_char> *rest_11_00;
  ArrayPtr<const_char> *rest_12_00;
  ArrayPtr<const_char> *rest_13_00;
  ArrayPtr<const_char> *rest_14_00;
  String *rest_15_00;
  ArrayPtr<const_char> *rest_16_00;
  ArrayPtr<const_char> *rest_17_00;
  ArrayPtr<const_char> *rest_18_00;
  String *rest_19_00;
  ArrayPtr<const_char> *rest_20_00;
  CappedArray<char,_14UL> *rest_21_00;
  ArrayPtr<const_char> *rest_22_00;
  StringTree *rest_23_00;
  ArrayPtr<const_char> *rest_24_00;
  String *rest_25_00;
  ArrayPtr<const_char> *rest_26_00;
  ArrayPtr<const_char> *rest_27_00;
  ArrayPtr<const_char> *rest_28_00;
  ArrayPtr<const_char> *rest_29_00;
  ArrayPtr<const_char> *rest_30_00;
  ArrayPtr<const_char> *rest_31_00;
  ArrayPtr<const_char> *rest_32_00;
  String *rest_33_00;
  ArrayPtr<const_char> *rest_34_00;
  CappedArray<char,_14UL> *rest_35_00;
  ArrayPtr<const_char> *rest_36_00;
  ArrayPtr<const_char> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  ArrayPtr<const_char> *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(first);
  pos_00 = _::fill<kj::ArrayPtr<char_const>>(pos,pAVar1);
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(rest);
  rest_38 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  rest_1_00 = fwd<kj::String>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  rest_4_00 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  rest_5_00 = fwd<kj::String>(rest_6);
  rest_6_00 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  rest_7_00 = fwd<kj::CappedArray<char,14ul>>(rest_8);
  rest_8_00 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  rest_9_00 = fwd<kj::StringTree>(rest_10);
  rest_10_00 = fwd<kj::ArrayPtr<char_const>>(rest_11);
  rest_11_00 = fwd<kj::ArrayPtr<char_const>>(rest_12);
  rest_12_00 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  rest_13_00 = fwd<kj::ArrayPtr<char_const>>(rest_14);
  rest_14_00 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  rest_15_00 = fwd<kj::String>(rest_16);
  rest_16_00 = fwd<kj::ArrayPtr<char_const>>(rest_17);
  rest_17_00 = fwd<kj::ArrayPtr<char_const>>(rest_18);
  rest_18_00 = fwd<kj::ArrayPtr<char_const>>(rest_19);
  rest_19_00 = fwd<kj::String>(rest_20);
  rest_20_00 = fwd<kj::ArrayPtr<char_const>>(rest_21);
  rest_21_00 = fwd<kj::CappedArray<char,14ul>>(rest_22);
  rest_22_00 = fwd<kj::ArrayPtr<char_const>>(rest_23);
  rest_23_00 = fwd<kj::StringTree>(rest_24);
  rest_24_00 = fwd<kj::ArrayPtr<char_const>>(rest_25);
  rest_25_00 = fwd<kj::String>(rest_26);
  rest_26_00 = fwd<kj::ArrayPtr<char_const>>(rest_27);
  rest_27_00 = fwd<kj::ArrayPtr<char_const>>(rest_28);
  rest_28_00 = fwd<kj::ArrayPtr<char_const>>(rest_29);
  rest_29_00 = fwd<kj::ArrayPtr<char_const>>(rest_30);
  rest_30_00 = fwd<kj::ArrayPtr<char_const>>(rest_31);
  rest_31_00 = fwd<kj::ArrayPtr<char_const>>(rest_32);
  rest_32_00 = fwd<kj::ArrayPtr<char_const>>(rest_33);
  rest_33_00 = fwd<kj::String>(rest_34);
  rest_34_00 = fwd<kj::ArrayPtr<char_const>>(rest_35);
  rest_35_00 = fwd<kj::CappedArray<char,14ul>>(rest_36);
  rest_36_00 = fwd<kj::ArrayPtr<char_const>>(rest_37);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (this,pos_00,branchIndex,pAVar1,rest_38,rest_1_00,rest_2_00,rest_3_00,rest_4_00,
             rest_5_00,rest_6_00,rest_7_00,rest_8_00,rest_9_00,rest_10_00,rest_11_00,rest_12_00,
             rest_13_00,rest_14_00,rest_15_00,rest_16_00,rest_17_00,rest_18_00,rest_19_00,rest_20_00
             ,rest_21_00,rest_22_00,rest_23_00,rest_24_00,rest_25_00,rest_26_00,rest_27_00,
             rest_28_00,rest_29_00,rest_30_00,rest_31_00,rest_32_00,rest_33_00,rest_34_00,rest_35_00
             ,rest_36_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}